

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPIUnpack_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  Value *value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  BaseType BVar3;
  FieldDef *def;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  int iVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  pointer ppVar12;
  bool bVar13;
  string offset;
  string defaultValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string nullableValueAccessOperator;
  string object_type;
  string constructor_args;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  constructor_args._M_dataplus._M_p = (pointer)&constructor_args.field_2;
  constructor_args._M_string_length = 0;
  constructor_args.field_2._M_local_buf[0] = '\0';
  ppVar12 = (non_deprecated_fields->
            super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_78 = non_deprecated_fields;
  if (ppVar12 !=
      (non_deprecated_fields->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      def = ppVar12->second;
      (*(this->namer_).super_Namer._vptr_Namer[0x12])(&object_type,&this->namer_,def);
      if (constructor_args._M_string_length != 0) {
        std::__cxx11::string::append((char *)&constructor_args);
      }
      std::operator+(&nullableValueAccessOperator,"      ",&object_type);
      plVar5 = (long *)std::__cxx11::string::append((char *)&nullableValueAccessOperator);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        defaultValue.field_2._M_allocated_capacity = *psVar7;
        defaultValue.field_2._8_8_ = plVar5[3];
        defaultValue._M_dataplus._M_p = (pointer)&defaultValue.field_2;
      }
      else {
        defaultValue.field_2._M_allocated_capacity = *psVar7;
        defaultValue._M_dataplus._M_p = (pointer)*plVar5;
      }
      defaultValue._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&constructor_args,(ulong)defaultValue._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
        operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
        operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                        nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
      }
      value = &def->value;
      getDefaultValue_abi_cxx11_(&defaultValue,this,value);
      bVar13 = defaultValue._M_string_length != 0;
      bVar2 = struct_def->fixed;
      iVar9 = 0x35f1ae;
      if (bVar13 || (bVar2 & 1U) != 0) {
        iVar9 = 0x36bc82;
      }
      nullableValueAccessOperator._M_dataplus._M_p = (pointer)&nullableValueAccessOperator.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&nullableValueAccessOperator,iVar9,((byte)~(bVar13 | bVar2) & 1) + iVar9)
      ;
      BVar3 = (value->type).base_type;
      if (BVar3 == BASE_TYPE_VECTOR) {
        if ((def->value).type.element == BASE_TYPE_STRUCT) {
          std::operator+(&local_150,&object_type,&nullableValueAccessOperator);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
          offset._M_dataplus._M_p = (pointer)&offset.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar7) {
            offset.field_2._M_allocated_capacity = *psVar7;
            offset.field_2._8_8_ = plVar5[3];
          }
          else {
            offset.field_2._M_allocated_capacity = *psVar7;
            offset._M_dataplus._M_p = (pointer)*plVar5;
          }
          offset._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
          goto LAB_001cd73a;
        }
        GenReaderTypeName_abi_cxx11_
                  (&offset,this,&value->type,(struct_def->super_Definition).defined_namespace,def,
                   false,false,true);
        std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)offset._M_dataplus._M_p != &offset.field_2) {
          operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&constructor_args);
        NumToString<unsigned_short>(&offset,(def->value).offset);
        if (bVar13 || (bVar2 & 1U) != 0) {
          std::operator+(&local_70,"(_bc, _bcOffset, ",&offset);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_b8 = &local_a8;
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_a8 = *plVar8;
            lStack_a0 = plVar5[3];
          }
          else {
            local_a8 = *plVar8;
            local_b8 = (long *)*plVar5;
          }
          local_b0 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b8,(ulong)defaultValue._M_dataplus._M_p);
          local_98 = &local_88;
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_88 = *plVar8;
            lStack_80 = plVar5[3];
          }
          else {
            local_88 = *plVar8;
            local_98 = (long *)*plVar5;
          }
          local_90 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        }
        else {
          std::operator+(&local_50,"Nullable(_bc, _bcOffset, ",&offset);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
        }
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_150.field_2._M_allocated_capacity = *psVar7;
          local_150.field_2._8_8_ = puVar6[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar7;
          local_150._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_150._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)psVar7 = 0;
        std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)local_150._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (bVar13 || (bVar2 & 1U) != 0) {
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          uVar10 = local_70.field_2._M_allocated_capacity;
          _Var11._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_001cd91b:
            operator_delete(_Var11._M_p,uVar10 + 1);
          }
        }
        else {
          uVar10 = local_50.field_2._M_allocated_capacity;
          _Var11._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001cd91b;
        }
        uVar10 = offset.field_2._M_allocated_capacity;
        _Var11._M_p = offset._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)offset._M_dataplus._M_p == &offset.field_2) goto LAB_001cd93f;
LAB_001cd937:
        operator_delete(_Var11._M_p,uVar10 + 1);
      }
      else if (BVar3 == BASE_TYPE_STRUCT) {
        std::operator+(&local_150,&object_type,&nullableValueAccessOperator);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
        offset._M_dataplus._M_p = (pointer)&offset.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          offset.field_2._M_allocated_capacity = *psVar7;
          offset.field_2._8_8_ = plVar5[3];
        }
        else {
          offset.field_2._M_allocated_capacity = *psVar7;
          offset._M_dataplus._M_p = (pointer)*plVar5;
        }
        offset._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&constructor_args,(ulong)offset._M_dataplus._M_p);
LAB_001cd73a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)offset._M_dataplus._M_p != &offset.field_2) {
          operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
        }
        uVar10 = local_150.field_2._M_allocated_capacity;
        _Var11._M_p = local_150._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) goto LAB_001cd937;
      }
      else {
        std::__cxx11::string::_M_append
                  ((char *)&constructor_args,(ulong)object_type._M_dataplus._M_p);
      }
LAB_001cd93f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
        operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                        nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
        operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)object_type._M_dataplus._M_p != &object_type.field_2) {
        operator_delete(object_type._M_dataplus._M_p,object_type.field_2._M_allocated_capacity + 1);
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 !=
             (local_78->
             super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&object_type,&this->namer_,struct_def);
  std::operator+(&offset,"  ",&object_type);
  plVar5 = (long *)std::__cxx11::string::append((char *)&offset);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    nullableValueAccessOperator.field_2._M_allocated_capacity = *psVar7;
    nullableValueAccessOperator.field_2._8_8_ = plVar5[3];
    nullableValueAccessOperator._M_dataplus._M_p = (pointer)&nullableValueAccessOperator.field_2;
  }
  else {
    nullableValueAccessOperator.field_2._M_allocated_capacity = *psVar7;
    nullableValueAccessOperator._M_dataplus._M_p = (pointer)*plVar5;
  }
  nullableValueAccessOperator._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&nullableValueAccessOperator,
                              (ulong)object_type._M_dataplus._M_p);
  paVar1 = &defaultValue.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    defaultValue.field_2._M_allocated_capacity = *psVar7;
    defaultValue.field_2._8_8_ = plVar5[3];
    defaultValue._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    defaultValue.field_2._M_allocated_capacity = *psVar7;
    defaultValue._M_dataplus._M_p = (pointer)*plVar5;
  }
  defaultValue._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&defaultValue);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar4 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultValue._M_dataplus._M_p != paVar1) {
    operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nullableValueAccessOperator._M_dataplus._M_p != &nullableValueAccessOperator.field_2) {
    operator_delete(nullableValueAccessOperator._M_dataplus._M_p,
                    nullableValueAccessOperator.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offset._M_dataplus._M_p != &offset.field_2) {
    operator_delete(offset._M_dataplus._M_p,offset.field_2._M_allocated_capacity + 1);
  }
  if (constructor_args._M_string_length != 0) {
    std::operator+(&defaultValue,"\n",&constructor_args);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)defaultValue._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)defaultValue._M_dataplus._M_p != paVar1) {
      operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)object_type._M_dataplus._M_p != &object_type.field_2) {
    operator_delete(object_type._M_dataplus._M_p,object_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)constructor_args._M_dataplus._M_p != &constructor_args.field_2) {
    operator_delete(constructor_args._M_dataplus._M_p,
                    CONCAT71(constructor_args.field_2._M_allocated_capacity._1_7_,
                             constructor_args.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPIUnpack(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      " + field_name + ": ";

      const Type &type = field.value.type;
      std::string defaultValue = getDefaultValue(field.value);
      bool isNullable = defaultValue.empty() && !struct_def.fixed;
      std::string nullableValueAccessOperator = isNullable ? "?" : "";
      if (type.base_type == BASE_TYPE_STRUCT) {
        constructor_args +=
            field_name + nullableValueAccessOperator + ".unpack()";
      } else if (type.base_type == BASE_TYPE_VECTOR) {
        if (type.VectorType().base_type == BASE_TYPE_STRUCT) {
          constructor_args += field_name + nullableValueAccessOperator +
                              ".map((e) => e.unpack()).toList()";
        } else {
          constructor_args +=
              GenReaderTypeName(field.value.type, struct_def.defined_namespace,
                                field, false, false);
          constructor_args += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          constructor_args +=
              isNullable
                  ? "Nullable(_bc, _bcOffset, " + offset + ")"
                  : "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
        }
      } else {
        constructor_args += field_name;
      }
    }

    const std::string object_type = namer_.ObjectType(struct_def);
    std::string code = "  " + object_type + " unpack() => " + object_type + "(";
    if (!constructor_args.empty()) code += "\n" + constructor_args;
    code += ");\n";
    return code;
  }